

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitmap.cpp
# Opt level: O2

void Assimp::Bitmap::WriteHeader(Header *header,IOStream *file)

{
  uint8_t data [14];
  
  data._0_2_ = header->type;
  data._2_4_ = header->size;
  data._6_4_ = *(undefined4 *)&header->reserved1;
  data._10_4_ = header->offset;
  (*file->_vptr_IOStream[3])(file,data,0xe,1);
  return;
}

Assistant:

void Bitmap::WriteHeader(Header& header, IOStream* file) {
        uint8_t data[Header::header_size];

        std::size_t offset = 0;

        offset += Copy(&data[offset], header.type);
        offset += Copy(&data[offset], header.size);
        offset += Copy(&data[offset], header.reserved1);
        offset += Copy(&data[offset], header.reserved2);
                  Copy(&data[offset], header.offset);

        file->Write(data, Header::header_size, 1);
    }